

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

void ptls_hexdump(char *dst,void *_src,size_t len)

{
  long lVar1;
  size_t sVar2;
  
  if (len != 0) {
    lVar1 = 0;
    sVar2 = 0;
    do {
      dst[sVar2 * 2] = "0123456789abcdef"[*(byte *)((long)_src + sVar2) >> 4];
      dst[sVar2 * 2 + 1] = "0123456789abcdef"[*(byte *)((long)_src + sVar2) & 0xf];
      sVar2 = sVar2 + 1;
      lVar1 = lVar1 + -2;
    } while (len != sVar2);
    dst = dst + -lVar1;
  }
  *dst = '\0';
  return;
}

Assistant:

void ptls_hexdump(char *dst, const void *_src, size_t len)
{
    const uint8_t *src = _src;
    size_t i;

    for (i = 0; i != len; ++i) {
        *dst++ = "0123456789abcdef"[src[i] >> 4];
        *dst++ = "0123456789abcdef"[src[i] & 0xf];
    }
    *dst++ = '\0';
}